

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

QRect __thiscall QLabelPrivate::documentRect(QLabelPrivate *this)

{
  QWidget *this_00;
  LayoutDirection direction;
  Alignment AVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  QRect QVar8;
  QFontMetrics local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  QVar8 = QWidget::contentsRect(this_00);
  iVar4 = this->margin;
  if ((this->field_0x340 & 0x10) == 0) {
    direction = QWidget::layoutDirection(this_00);
  }
  else {
    direction = textDirection(this);
  }
  iVar3 = QVar8.x1.m_i.m_i + iVar4;
  iVar7 = QVar8.y1.m_i.m_i + iVar4;
  iVar6 = QVar8.x2.m_i.m_i - iVar4;
  iVar4 = QVar8.y2.m_i.m_i - iVar4;
  AVar1 = QStyle::visualAlignment(direction,(Alignment)this->align);
  uVar5 = this->indent;
  if ((int)uVar5 < 0) {
    iVar2 = QFrame::frameWidth((QFrame *)this_00);
    if (iVar2 == 0) goto LAB_003e5d1a;
    QWidget::fontMetrics((QWidget *)local_40);
    iVar2 = QFontMetrics::horizontalAdvance((QChar)(char16_t)local_40);
    uVar5 = iVar2 / 2 - this->margin;
    QFontMetrics::~QFontMetrics(local_40);
  }
  if (0 < (int)uVar5) {
    iVar3 = iVar3 + (-((uint)AVar1.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                             super_QFlagsStorage<Qt::AlignmentFlag>.i & 1) & uVar5);
    iVar6 = iVar6 - (((int)AVar1.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                           super_QFlagsStorage<Qt::AlignmentFlag>.i << 0x1e) >> 0x1f & uVar5);
    iVar7 = (((int)AVar1.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                   super_QFlagsStorage<Qt::AlignmentFlag>.i << 0x1a) >> 0x1f & uVar5) + iVar7;
    iVar4 = iVar4 - (((int)AVar1.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                           super_QFlagsStorage<Qt::AlignmentFlag>.i << 0x19) >> 0x1f & uVar5);
  }
LAB_003e5d1a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar8.y1.m_i = iVar7;
  QVar8.x1.m_i = iVar3;
  QVar8.y2.m_i = iVar4;
  QVar8.x2.m_i = iVar6;
  return QVar8;
}

Assistant:

QRect QLabelPrivate::documentRect() const
{
    Q_Q(const QLabel);
    Q_ASSERT_X(isTextLabel, "documentRect", "document rect called for label that is not a text label!");
    QRect cr = q->contentsRect();
    cr.adjust(margin, margin, -margin, -margin);
    const int align = QStyle::visualAlignment(isTextLabel ? textDirection()
                                                          : q->layoutDirection(), QFlag(this->align));
    int m = indent;
    if (m < 0 && q->frameWidth()) // no indent, but we do have a frame
        m = q->fontMetrics().horizontalAdvance(u'x') / 2 - margin;
    if (m > 0) {
        if (align & Qt::AlignLeft)
            cr.setLeft(cr.left() + m);
        if (align & Qt::AlignRight)
            cr.setRight(cr.right() - m);
        if (align & Qt::AlignTop)
            cr.setTop(cr.top() + m);
        if (align & Qt::AlignBottom)
            cr.setBottom(cr.bottom() - m);
    }
    return cr;
}